

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

void __thiscall Am_Value_List::Set(Am_Value_List *this,Am_Generic_Procedure *value,bool unique)

{
  Am_Value_List_Data *this_00;
  Am_Value store;
  Am_Value local_20;
  
  this_00 = this->data;
  if (this_00 != (Am_Value_List_Data *)0x0 && unique) {
    Am_Value_List_Data::Make_Unique(this_00,&this->data,&this->item);
  }
  local_20.type = 10;
  local_20.value.proc_value = value;
  Am_Value_List_Data::Set(this_00,&local_20,this->item);
  Am_Value::~Am_Value(&local_20);
  return;
}

Assistant:

void Am_Value_List::Set(const Am_Value &value, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  }
  data->Set(value, item);
}